

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_dma_heap.c
# Opt level: O0

void dma_heap_init(void)

{
  bool bVar1;
  int iVar2;
  MPP_RET MVar3;
  ulong uVar4;
  uint local_18;
  RK_U32 i;
  RK_U32 all_success;
  DmaHeapInfo *info;
  
  bVar1 = true;
  mpp_env_get_u32("dma_heap_debug",&dma_heap_debug,0);
  for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
    uVar4 = (ulong)local_18;
    if (heap_infos[uVar4].fd < 1) {
      iVar2 = try_open_path(heap_infos[uVar4].name);
      heap_infos[uVar4].fd = iVar2;
      if (heap_infos[uVar4].fd < 1) {
        bVar1 = false;
      }
    }
  }
  if (!bVar1) {
    for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
      if ((((heap_infos[local_18].fd < 1) && (MVar3 = try_flip_flag(local_18,2), MVar3 != MPP_OK))
          && (MVar3 = try_flip_flag(local_18,1), MVar3 != MPP_OK)) &&
         ((MVar3 = try_flip_flag(local_18,3), MVar3 != MPP_OK && ((dma_heap_debug & 8) != 0)))) {
        _mpp_log_l(4,"mpp_dma_heap","dma-heap type %x - %s remap failed\n",(char *)0x0,
                   (ulong)local_18,heap_infos[local_18].name);
      }
    }
  }
  return;
}

Assistant:

__attribute__ ((constructor))
void dma_heap_init(void)
{
    DmaHeapInfo *info = NULL;
    RK_U32 all_success = 1;
    RK_U32 i;

    mpp_env_get_u32("dma_heap_debug", &dma_heap_debug, 0);

    /* go through all heap first */
    for (i = 0; i < MPP_ARRAY_ELEMS(heap_infos); i++) {
        info = &heap_infos[i];

        if (info->fd > 0)
            continue;

        info->fd = try_open_path(info->name);
        if (info->fd <= 0)
            all_success = 0;
    }

    if (!all_success) {
        /* check remaining failed heap mapping */
        for (i = 0; i < MPP_ARRAY_ELEMS(heap_infos); i++) {
            info = &heap_infos[i];

            if (info->fd > 0)
                continue;

            /* if original heap failed then try revert cacheable flag */
            if (MPP_OK == try_flip_flag((RK_U32)i, MPP_ALLOC_FLAG_CACHABLE))
                continue;

            /* if cacheable heap failed then try revert dma32 flag */
            if (MPP_OK == try_flip_flag((RK_U32)i, MPP_ALLOC_FLAG_DMA32))
                continue;

            /* if dma32 heap failed then try revert both cacheable and dma32 flag */
            if (MPP_OK == try_flip_flag((RK_U32)i, MPP_ALLOC_FLAG_CACHABLE | MPP_ALLOC_FLAG_DMA32))
                continue;

            dma_heap_dbg_chk("dma-heap type %x - %s remap failed\n", i, info->name);
        }
    }
}